

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_options.cpp
# Opt level: O0

void __thiscall Potassco::ProgramOptions::OptionGroup::~OptionGroup(OptionGroup *this)

{
  string *in_RDI;
  vector<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>,_std::allocator<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>_>_>
  *unaff_retaddr;
  
  std::
  vector<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>,_std::allocator<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>_>_>
  ::~vector(unaff_retaddr);
  std::__cxx11::string::~string(in_RDI);
  return;
}

Assistant:

OptionGroup::~OptionGroup() {}